

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-magic.c
# Opt level: O0

_Bool borg_spell(borg_spells spell)

{
  _Bool _Var1;
  int iVar2;
  uint uVar3;
  borg_magic *pbVar4;
  char *what;
  borg_magic *as;
  int spell_num;
  int i;
  borg_spells spell_local;
  
  iVar2 = borg_get_spell_number(spell);
  if (iVar2 < 0) {
    i._3_1_ = false;
  }
  else {
    pbVar4 = borg_magics + iVar2;
    _Var1 = borg_spell_okay(spell);
    if (_Var1) {
      uVar3 = (uint)borg.book_idx[pbVar4->book];
      if ((int)uVar3 < 0) {
        i._3_1_ = false;
      }
      else {
        what = format("# Casting %s (%d,%d).",pbVar4->name,(ulong)uVar3,
                      (ulong)(uint)pbVar4->book_offset);
        borg_note(what);
        borg_keypress(0x6d);
        borg_keypress((int)"abcdefgimnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ"[(int)uVar3]);
        borg_keypress((int)"abcdefgimnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ"[pbVar4->book_offset]);
        pbVar4->times = pbVar4->times + 1;
        i._3_1_ = true;
      }
    }
    else {
      i._3_1_ = false;
    }
  }
  return i._3_1_;
}

Assistant:

bool borg_spell(const enum borg_spells spell)
{
    int i;

    int spell_num = borg_get_spell_number(spell);
    if (spell_num < 0)
        return false;

    borg_magic *as = &borg_magics[spell_num];

    /* Require ability (right now) */
    if (!borg_spell_okay(spell))
        return false;

    /* Look for the book */
    i = borg.book_idx[as->book];

    /* Paranoia */
    if (i < 0)
        return false;

    /* Debugging Info */
    borg_note(format("# Casting %s (%d,%d).", as->name, i, as->book_offset));

    /* Cast a spell */
    borg_keypress('m');
    borg_keypress(all_letters_nohjkl[i]);
    borg_keypress(all_letters_nohjkl[as->book_offset]);

    /* increment the spell counter */
    as->times++;

    /* Success */
    return true;
}